

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O0

ON_PhysicallyBasedMaterialUserData * __thiscall
ON_PhysicallyBasedMaterial::Impl::UserData(Impl *this)

{
  ON_Material *this_00;
  ON_PhysicallyBasedMaterialUserData *this_01;
  ON_UUID local_30;
  ON_UserData *local_20;
  ON_UserData *pUD;
  Impl *this_local;
  
  this_00 = this->material;
  pUD = (ON_UserData *)this;
  local_30 = ON_ClassId::Uuid(&ON_PhysicallyBasedMaterialUserData::
                               m_ON_PhysicallyBasedMaterialUserData_class_rtti);
  local_20 = ON_Object::GetUserData((ON_Object *)this_00,&local_30);
  this_local = (Impl *)local_20;
  if (local_20 == (ON_UserData *)0x0) {
    if (this->m_pDummy == (ON_PhysicallyBasedMaterialUserData *)0x0) {
      this_01 = (ON_PhysicallyBasedMaterialUserData *)operator_new(0x180);
      ON_PhysicallyBasedMaterialUserData::ON_PhysicallyBasedMaterialUserData(this_01);
      this->m_pDummy = this_01;
      this_local = (Impl *)this->m_pDummy;
    }
    else {
      this_local = (Impl *)this->m_pDummy;
    }
  }
  return (ON_PhysicallyBasedMaterialUserData *)this_local;
}

Assistant:

const ON_PhysicallyBasedMaterialUserData& UserData() const
  {
    const auto pUD = material->GetUserData(ON_CLASS_ID(ON_PhysicallyBasedMaterialUserData));
    if (pUD)
    {
      return static_cast<const ON_PhysicallyBasedMaterialUserData&>(*pUD);
    }

    if (m_pDummy)
    {
      return *m_pDummy;
    }

    //This is the const version
    m_pDummy = new ON_PhysicallyBasedMaterialUserData();
    return *m_pDummy;
  }